

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn_factory.h
# Opt level: O0

void __thiscall
iqnet::Serial_conn_factory<iqxmlrpc::(anonymous_namespace)::Https_server_connection>::
create_accepted(Serial_conn_factory<iqxmlrpc::(anonymous_namespace)::Https_server_connection> *this,
               Socket *sock)

{
  Https_server_connection *this_00;
  Https_server_connection *c;
  Socket *sock_local;
  Serial_conn_factory<iqxmlrpc::(anonymous_namespace)::Https_server_connection> *this_local;
  
  this_00 = (Https_server_connection *)operator_new(0x138);
  iqxmlrpc::anon_unknown_0::Https_server_connection::Https_server_connection(this_00,sock);
  (*(this->super_Accepted_conn_factory)._vptr_Accepted_conn_factory[3])(this,this_00);
  (*(this_00->super_Reaction_connection).super_Connection.super_Connection.super_Event_handler.
    _vptr_Event_handler[10])();
  return;
}

Assistant:

void create_accepted( const Socket& sock )
  {
    Conn_type* c = new Conn_type( sock );
    post_create( c );
    c->post_accept();
  }